

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void __thiscall despot::log_ostream::log_ostream(log_ostream *this,ostream *out,string *marker)

{
  undefined1 *this_00;
  pointer pcVar1;
  string local_48;
  
  this_00 = &(this->super_ostream).field_0x98;
  std::ios_base::ios_base((ios_base *)this_00);
  *(undefined8 *)&this->field_0x170 = 0;
  *(undefined2 *)&this->field_0x178 = 0;
  *(undefined8 *)&this->field_0x180 = 0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(undefined8 *)&this->field_0x198 = 0;
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x1913b0;
  *(undefined8 *)&(this->super_ostream).field_0x98 = 0x1913d8;
  std::ios::init((streambuf *)this_00);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x1912c8;
  *(undefined8 *)&(this->super_ostream).field_0x98 = 0x1912f0;
  pcVar1 = (marker->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + marker->_M_string_length);
  log_buf::log_buf((log_buf *)&(this->super_ostream).field_0x8,out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

log_ostream::log_ostream(ostream& out, string marker) :
	ostream(&buffer_),
	buffer_(out, marker) {
}